

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_cache_bin_fill_small
               (tsdn_t *tsdn,arena_t *arena,cache_bin_t *cache_bin,szind_t binind,
               cache_bin_sz_t nfill)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  uint uVar4;
  bin_t *pbVar5;
  void *pvVar6;
  edata_t *item;
  uint in_ECX;
  size_t *psVar7;
  long in_RDX;
  undefined8 in_RSI;
  arena_t *in_RDI;
  ushort in_R8W;
  uint cnt;
  uint nfree_1;
  uint tofill;
  edata_t *slabcur;
  arena_bin_flush_batch_state_t batch_flush_state;
  bin_t *bin;
  uint binshard;
  cache_bin_sz_t filled;
  _Bool alloc_and_retry;
  edata_t *fresh_slab;
  _Bool made_progress;
  cache_bin_ptr_array_t ptrs;
  bin_info_t *bin_info;
  uint ndalloc_slabs;
  uint preallocated_slabs;
  edata_t *slab_1;
  edata_t *slab;
  uint i_2;
  size_t i_1;
  size_t i;
  bin_remote_free_data_t remote_free_data [16];
  size_t npushes;
  size_t nelems_to_pop;
  bin_with_batch_t *batched_bin;
  uint nfree;
  slab_data_t *slab_data;
  size_t regind;
  bin_info_t *bin_info_1;
  size_t regind_1;
  size_t regind_2;
  size_t diff;
  uint64_t *prng_state;
  ticker_geom_t *decay_ticker;
  tsd_t *tsd;
  uint8_t state_1;
  uint8_t state;
  uint8_t state_2;
  arena_t *in_stack_fffffffffffffb28;
  arena_t *in_stack_fffffffffffffb30;
  uint in_stack_fffffffffffffb38;
  uint in_stack_fffffffffffffb3c;
  edata_t *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  uint in_stack_fffffffffffffb4c;
  edata_t *in_stack_fffffffffffffb58;
  div_info_t in_stack_fffffffffffffb60;
  uint32_t in_stack_fffffffffffffb64;
  arena_t *in_stack_fffffffffffffb68;
  tsdn_t *in_stack_fffffffffffffb70;
  void **in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  uint in_stack_fffffffffffffb84;
  bin_info_t *in_stack_fffffffffffffb88;
  edata_t *in_stack_fffffffffffffb90;
  uint local_450 [2];
  edata_list_active_t aeStack_448 [2];
  ushort local_434;
  edata_t *local_430;
  uint local_37c;
  ulong local_328;
  ulong local_320;
  size_t local_318;
  uint64_t auStack_310 [31];
  size_t local_218;
  size_t local_210;
  bin_t *local_208;
  edata_list_active_t *local_200;
  uint *local_1f8;
  uint local_1ec;
  undefined1 *local_1e8;
  uint local_1dc;
  div_info_t *local_1d8;
  bin_t *local_1d0;
  undefined8 local_1c8;
  arena_t *local_1c0;
  size_t local_1b8;
  uint local_1ac;
  slab_data_t *local_1a8;
  size_t local_1a0;
  bin_info_t *local_198;
  edata_list_active_t *local_190;
  uint *local_188;
  uint local_17c;
  undefined1 *local_178;
  edata_t *local_170;
  edata_t *local_168;
  uint local_15c;
  div_info_t *local_158;
  bin_t *local_150;
  undefined8 local_148;
  arena_t *local_140;
  size_t local_138;
  edata_t *local_130;
  edata_t *local_128;
  uint local_11c;
  div_info_t *local_118;
  size_t local_110;
  size_t local_108;
  edata_t *local_100;
  edata_t *local_f8;
  uint local_ec;
  div_info_t *local_e8;
  undefined1 *local_e0;
  bin_t *local_d8;
  undefined1 local_bd;
  uint local_bc;
  uint64_t *local_b8;
  locked_u64_t *local_b0;
  undefined4 local_9c;
  undefined1 local_71;
  undefined1 local_51;
  undefined1 local_29;
  
  cache_bin_init_ptr_array_for_fill
            ((cache_bin_t *)in_stack_fffffffffffffb30,
             (cache_bin_ptr_array_t *)in_stack_fffffffffffffb28,0);
  bVar1 = true;
  local_430 = (edata_t *)0x0;
  local_434 = 0;
  pbVar5 = duckdb_je_arena_bin_choose
                     ((tsdn_t *)in_stack_fffffffffffffb40,
                      (arena_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                      (szind_t)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                      (uint *)in_stack_fffffffffffffb28);
  do {
    bVar2 = false;
    malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                      (malloc_mutex_t *)in_stack_fffffffffffffb40);
    if (in_ECX < duckdb_je_bin_info_nbatched_sizes) {
      in_stack_fffffffffffffb60.magic = duckdb_je_arena_binind_div_info[in_ECX].magic;
      in_stack_fffffffffffffb64 = duckdb_je_bin_infos[in_ECX].nregs;
      in_stack_fffffffffffffb68 = (arena_t *)0x0;
      local_450[0] = 0;
      edata_list_active_init(aeStack_448);
      local_1e8 = &stack0xfffffffffffffb70;
      local_1f8 = local_450;
      local_200 = aeStack_448;
      local_1ec = 8;
      local_208 = pbVar5;
      local_1dc = in_ECX;
      local_1d8 = (div_info_t *)&stack0xfffffffffffffb60;
      local_1d0 = pbVar5;
      local_1c8 = in_RSI;
      local_1c0 = in_RDI;
      local_210 = duckdb_je_batcher_pop_begin
                            ((tsdn_t *)in_stack_fffffffffffffb88,
                             (batcher_t *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      local_1b8 = local_210;
      if (local_210 == 0xffffffffffffffff) {
        malloc_mutex_assert_not_owner
                  ((tsdn_t *)in_stack_fffffffffffffb28,(malloc_mutex_t *)0x24b6cac);
      }
      else {
        malloc_mutex_assert_owner((tsdn_t *)in_stack_fffffffffffffb28,(malloc_mutex_t *)0x24b6cd1);
        local_218 = duckdb_je_batcher_pop_get_pushes
                              ((tsdn_t *)in_stack_fffffffffffffb30,
                               (batcher_t *)in_stack_fffffffffffffb28);
        for (local_320 = 0; local_320 < local_210; local_320 = local_320 + 1) {
          psVar7 = &local_208[1].stats.curregs + local_320 * 2;
          (&local_318)[local_320 * 2] = *psVar7;
          (&local_318)[local_320 * 2 + 1] = psVar7[1];
        }
        batcher_pop_end((tsdn_t *)in_stack_fffffffffffffb30,(batcher_t *)in_stack_fffffffffffffb28);
        for (local_328 = 0; local_328 < local_210; local_328 = local_328 + 1) {
          local_168 = (edata_t *)(&local_318)[local_328 * 2 + 1];
          in_stack_fffffffffffffb40 = (edata_t *)(&local_318)[local_328 * 2];
          local_140 = local_1c0;
          local_148 = local_1c8;
          local_150 = local_1d0;
          local_158 = local_1d8;
          local_15c = local_1dc;
          local_178 = local_1e8;
          local_17c = local_1ec;
          local_188 = local_1f8;
          local_190 = local_200;
          local_198 = duckdb_je_bin_infos + local_1dc;
          local_118 = local_1d8;
          local_11c = local_1dc;
          local_e8 = local_1d8;
          local_ec = local_1dc;
          local_170 = in_stack_fffffffffffffb40;
          local_130 = in_stack_fffffffffffffb40;
          local_128 = local_168;
          local_100 = in_stack_fffffffffffffb40;
          local_f8 = local_168;
          pvVar6 = edata_addr_get(local_168);
          local_108 = (long)in_stack_fffffffffffffb40 - (long)pvVar6;
          local_1a0 = div_compute(local_e8,local_108);
          local_138 = local_1a0;
          local_110 = local_1a0;
          local_1a8 = edata_slab_data_get(local_168);
          bitmap_unset(local_1a8->bitmap,&local_198->bitmap_info,local_1a0);
          edata_nfree_inc(local_168);
          *(long *)(local_158 + 2) = *(long *)(local_158 + 2) + 1;
          local_1ac = edata_nfree_get(local_168);
          if (local_1ac == local_198->nregs) {
            duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                      ((tsdn_t *)in_stack_fffffffffffffb40,
                       (arena_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                       (edata_t *)in_stack_fffffffffffffb30,(bin_t *)in_stack_fffffffffffffb28);
            if (*local_188 < local_17c) {
              *(edata_t **)(local_178 + (ulong)*local_188 * 8) = local_168;
              *local_188 = *local_188 + 1;
            }
            else {
              edata_list_active_append(local_190,local_168);
            }
          }
          else if ((local_1ac == 1) && (local_168 != local_150->slabcur)) {
            duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                      ((tsdn_t *)in_stack_fffffffffffffb40,
                       (arena_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                       (edata_t *)in_stack_fffffffffffffb30,(bin_t *)in_stack_fffffffffffffb28);
          }
        }
        (local_1d0->stats).batch_pops = (local_1d0->stats).batch_pops + 1;
        (local_1d0->stats).batch_pushes = local_218 + (local_1d0->stats).batch_pushes;
        (local_1d0->stats).batch_pushed_elems = local_210 + (local_1d0->stats).batch_pushed_elems;
      }
    }
    while (local_434 < in_R8W) {
      in_stack_fffffffffffffb58 = pbVar5->slabcur;
      if ((in_stack_fffffffffffffb58 == (edata_t *)0x0) ||
         (uVar4 = edata_nfree_get(in_stack_fffffffffffffb58), uVar4 == 0)) {
        _Var3 = arena_bin_refill_slabcur_no_fresh_slab
                          ((tsdn_t *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                           (bin_t *)0x24b723c);
        if (_Var3) {
          if (local_430 == (edata_t *)0x0) {
            if (bVar1) {
              bVar2 = true;
            }
            break;
          }
          arena_bin_refill_slabcur_with_fresh_slab
                    ((tsdn_t *)in_stack_fffffffffffffb40,
                     (arena_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     (bin_t *)in_stack_fffffffffffffb30,
                     (szind_t)((ulong)in_stack_fffffffffffffb28 >> 0x20),(edata_t *)0x24b7280);
          local_430 = (edata_t *)0x0;
        }
      }
      else {
        in_stack_fffffffffffffb3c = edata_nfree_get(in_stack_fffffffffffffb58);
        if ((uint)in_R8W - (uint)local_434 < in_stack_fffffffffffffb3c) {
          in_stack_fffffffffffffb3c = (uint)in_R8W - (uint)local_434;
        }
        in_stack_fffffffffffffb4c = in_stack_fffffffffffffb3c;
        arena_slab_reg_alloc_batch
                  (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb84,
                   in_stack_fffffffffffffb78);
        bVar1 = true;
        local_434 = local_434 + (short)in_stack_fffffffffffffb4c;
      }
    }
    if (!bVar2) {
      (pbVar5->stats).nmalloc = (ulong)local_434 + (pbVar5->stats).nmalloc;
      (pbVar5->stats).nrequests = *(long *)(in_RDX + 8) + (pbVar5->stats).nrequests;
      (pbVar5->stats).curregs = (ulong)local_434 + (pbVar5->stats).curregs;
      (pbVar5->stats).nfills = (pbVar5->stats).nfills + 1;
      *(undefined8 *)(in_RDX + 8) = 0;
    }
    if (in_ECX < duckdb_je_bin_info_nbatched_sizes) {
      (pbVar5->stats).ndalloc =
           (long)&in_stack_fffffffffffffb68->nthreads[0].repr + (pbVar5->stats).ndalloc;
      (pbVar5->stats).curregs = (pbVar5->stats).curregs - (long)in_stack_fffffffffffffb68;
      local_e0 = &stack0xfffffffffffffb60;
      local_d8 = pbVar5;
    }
    malloc_mutex_unlock((tsdn_t *)in_stack_fffffffffffffb40,
                        (malloc_mutex_t *)
                        CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    _Var3 = arena_bin_has_batch(in_ECX);
    if (_Var3) {
      in_stack_fffffffffffffb38 = local_450[0];
      local_bd = edata_list_active_empty(aeStack_448);
      local_bc = in_stack_fffffffffffffb38;
      for (local_37c = 0; local_37c < local_450[0]; local_37c = local_37c + 1) {
        in_stack_fffffffffffffb30 = in_RDI;
        arena_get_from_edata(in_stack_fffffffffffffb40);
        duckdb_je_arena_slab_dalloc
                  ((tsdn_t *)in_stack_fffffffffffffb40,
                   (arena_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   (edata_t *)in_stack_fffffffffffffb30);
      }
      while (_Var3 = edata_list_active_empty(aeStack_448), ((_Var3 ^ 0xffU) & 1) != 0) {
        item = edata_list_active_first(aeStack_448);
        edata_list_active_remove(aeStack_448,item);
        in_stack_fffffffffffffb28 = in_RDI;
        arena_get_from_edata(in_stack_fffffffffffffb40);
        duckdb_je_arena_slab_dalloc
                  ((tsdn_t *)in_stack_fffffffffffffb40,
                   (arena_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   (edata_t *)in_stack_fffffffffffffb30);
      }
    }
    if (!bVar2) {
      if (local_430 != (edata_t *)0x0) {
        duckdb_je_arena_slab_dalloc
                  ((tsdn_t *)in_stack_fffffffffffffb40,
                   (arena_t *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                   (edata_t *)in_stack_fffffffffffffb30);
      }
      cache_bin_finish_fill
                ((cache_bin_t *)in_stack_fffffffffffffb40,
                 (cache_bin_ptr_array_t *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (cache_bin_sz_t)((ulong)in_stack_fffffffffffffb30 >> 0x30));
      local_9c = 1;
      if (in_RDI != (arena_t *)0x0) {
        local_51 = (undefined1)(in_RDI->stats).mutex_prof_data[9].n_spin_acquired;
        local_b0 = &(in_RDI->stats).pa_shard_stats.pac_stats.decay_dirty.purged;
        local_71 = (undefined1)(in_RDI->stats).mutex_prof_data[9].n_spin_acquired;
        local_b8 = &(in_RDI->stats).nflushes_large;
        local_29 = (undefined1)(in_RDI->stats).mutex_prof_data[9].n_spin_acquired;
        _Var3 = ticker_geom_ticks((ticker_geom_t *)
                                  CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                  (uint64_t *)in_stack_fffffffffffffb30,
                                  (int32_t)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                                  SUB81((ulong)in_stack_fffffffffffffb28 >> 0x18,0));
        if (_Var3) {
          duckdb_je_arena_decay
                    ((tsdn_t *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,false,false);
        }
      }
      return;
    }
    local_430 = arena_slab_alloc(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                 in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.magic,
                                 (bin_info_t *)in_stack_fffffffffffffb58);
    bVar1 = false;
  } while( true );
}

Assistant:

void
arena_cache_bin_fill_small(tsdn_t *tsdn, arena_t *arena,
    cache_bin_t *cache_bin, szind_t binind, const cache_bin_sz_t nfill) {
	assert(cache_bin_ncached_get_local(cache_bin) == 0);
	assert(nfill != 0);

	const bin_info_t *bin_info = &bin_infos[binind];

	CACHE_BIN_PTR_ARRAY_DECLARE(ptrs, nfill);
	cache_bin_init_ptr_array_for_fill(cache_bin, &ptrs, nfill);
	/*
	 * Bin-local resources are used first: 1) bin->slabcur, and 2) nonfull
	 * slabs.  After both are exhausted, new slabs will be allocated through
	 * arena_slab_alloc().
	 *
	 * Bin lock is only taken / released right before / after the while(...)
	 * refill loop, with new slab allocation (which has its own locking)
	 * kept outside of the loop.  This setup facilitates flat combining, at
	 * the cost of the nested loop (through goto label_refill).
	 *
	 * To optimize for cases with contention and limited resources
	 * (e.g. hugepage-backed or non-overcommit arenas), each fill-iteration
	 * gets one chance of slab_alloc, and a retry of bin local resources
	 * after the slab allocation (regardless if slab_alloc failed, because
	 * the bin lock is dropped during the slab allocation).
	 *
	 * In other words, new slab allocation is allowed, as long as there was
	 * progress since the previous slab_alloc.  This is tracked with
	 * made_progress below, initialized to true to jump start the first
	 * iteration.
	 *
	 * In other words (again), the loop will only terminate early (i.e. stop
	 * with filled < nfill) after going through the three steps: a) bin
	 * local exhausted, b) unlock and slab_alloc returns null, c) re-lock
	 * and bin local fails again.
	 */
	bool made_progress = true;
	edata_t *fresh_slab = NULL;
	bool alloc_and_retry = false;
	cache_bin_sz_t filled = 0;
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	/*
	 * This has some fields that are conditionally initialized down batch
	 * flush pathways.  This can trigger static analysis warnings deeper
	 * down in the static.  The accesses are guarded by the same checks as
	 * the initialization, but the analysis isn't able to track that across
	 * multiple stack frames.
	 */
	arena_bin_flush_batch_state_t batch_flush_state
	    JEMALLOC_CLANG_ANALYZER_SILENCE_INIT({0});
label_refill:
	malloc_mutex_lock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_lock(tsdn, arena, bin, binind, &batch_flush_state);

	while (filled < nfill) {
		/* Try batch-fill from slabcur first. */
		edata_t *slabcur = bin->slabcur;
		if (slabcur != NULL && edata_nfree_get(slabcur) > 0) {
			unsigned tofill = nfill - filled;
			unsigned nfree = edata_nfree_get(slabcur);
			unsigned cnt = tofill < nfree ? tofill : nfree;

			arena_slab_reg_alloc_batch(slabcur, bin_info, cnt,
			    &ptrs.ptr[filled]);
			made_progress = true;
			filled += cnt;
			continue;
		}
		/* Next try refilling slabcur from nonfull slabs. */
		if (!arena_bin_refill_slabcur_no_fresh_slab(tsdn, arena, bin)) {
			assert(bin->slabcur != NULL);
			continue;
		}

		/* Then see if a new slab was reserved already. */
		if (fresh_slab != NULL) {
			arena_bin_refill_slabcur_with_fresh_slab(tsdn, arena,
			    bin, binind, fresh_slab);
			assert(bin->slabcur != NULL);
			fresh_slab = NULL;
			continue;
		}

		/* Try slab_alloc if made progress (or never did slab_alloc). */
		if (made_progress) {
			assert(bin->slabcur == NULL);
			assert(fresh_slab == NULL);
			alloc_and_retry = true;
			/* Alloc a new slab then come back. */
			break;
		}

		/* OOM. */

		assert(fresh_slab == NULL);
		assert(!alloc_and_retry);
		break;
	} /* while (filled < nfill) loop. */

	if (config_stats && !alloc_and_retry) {
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += cache_bin->tstats.nrequests;
		bin->stats.curregs += filled;
		bin->stats.nfills++;
		cache_bin->tstats.nrequests = 0;
	}

	arena_bin_flush_batch_before_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);
	malloc_mutex_unlock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);

	if (alloc_and_retry) {
		assert(fresh_slab == NULL);
		assert(filled < nfill);
		assert(made_progress);

		fresh_slab = arena_slab_alloc(tsdn, arena, binind, binshard,
		    bin_info);
		/* fresh_slab NULL case handled in the for loop. */

		alloc_and_retry = false;
		made_progress = false;
		goto label_refill;
	}
	assert(filled == nfill || (fresh_slab == NULL && !made_progress));

	/* Release if allocated but not used. */
	if (fresh_slab != NULL) {
		assert(edata_nfree_get(fresh_slab) == bin_info->nregs);
		arena_slab_dalloc(tsdn, arena, fresh_slab);
		fresh_slab = NULL;
	}

	cache_bin_finish_fill(cache_bin, &ptrs, filled);
	arena_decay_tick(tsdn, arena);
}